

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,int du_stride,float *fdtbl,
              int DC,unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  float *d7p;
  uint uVar11;
  int iVar12;
  unsigned_short bits [2];
  unsigned_short M16zeroes [2];
  unsigned_short EOB [2];
  int startpos;
  int DU [64];
  
  EOB[0] = (*HTAC)[0];
  EOB[1] = (*HTAC)[1];
  M16zeroes[0] = HTAC[0xf0][0];
  M16zeroes[1] = HTAC[0xf0][1];
  lVar5 = (long)du_stride;
  if (du_stride != 0) {
    d7p = CDU + 7;
    lVar8 = 0;
    do {
      stbiw__jpg_DCT(d7p + -7,d7p + -6,d7p + -5,d7p + -4,d7p + -3,d7p + -2,d7p + -1,d7p);
      lVar8 = lVar8 + lVar5;
      d7p = d7p + lVar5;
    } while (lVar8 < (long)(ulong)(uint)(du_stride * 8));
  }
  lVar8 = 0;
  do {
    stbiw__jpg_DCT((float *)(lVar8 + (long)CDU),(float *)((long)CDU + lVar8 + lVar5 * 4),
                   (float *)((long)CDU + lVar8 + (ulong)(uint)(du_stride * 2) * 4),
                   (float *)((long)CDU + lVar8 + (long)(du_stride * 3) * 4),
                   (float *)((long)CDU + lVar8 + (ulong)(uint)(du_stride * 4) * 4),
                   (float *)((long)CDU + lVar8 + (long)(du_stride * 5) * 4),
                   (float *)((long)CDU + lVar8 + (long)(du_stride * 6) * 4),
                   (float *)((long)CDU + lVar8 + (long)(du_stride * 7) * 4));
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x20);
  lVar8 = 0;
  lVar6 = 0;
  do {
    lVar6 = (long)(int)lVar6;
    lVar7 = 0;
    do {
      DU[""[lVar6 + lVar7]] =
           (int)(CDU[lVar7] * fdtbl[lVar6 + lVar7] +
                *(float *)(&DAT_00195790 + (ulong)(CDU[lVar7] * fdtbl[lVar6 + lVar7] < 0.0) * 4));
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    lVar8 = lVar8 + 1;
    lVar6 = lVar6 + 8;
    CDU = CDU + lVar5;
  } while (lVar8 != 8);
  uVar2 = DU[0] - DC;
  if (uVar2 != 0) {
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar11 = 1;
    if (1 < uVar3) {
      uVar11 = (uVar1 ^ 0xffffffe0) + 0x21;
    }
    bits[1] = (unsigned_short)uVar11;
    bits[0] = ~(ushort)(-1 << ((byte)uVar11 & 0x1f)) & (short)((int)uVar2 >> 0x1f) + (short)uVar2;
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTDC[uVar11 & 0xff]);
    HTDC = &bits;
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,*HTDC);
  uVar2 = 0x40;
  do {
    uVar10 = (ulong)(uVar2 - 1);
    if (DU[uVar10] != 0) goto LAB_0016e312;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  uVar10 = 0;
LAB_0016e312:
  iVar9 = (int)uVar10;
  if (iVar9 != 0) {
    if (0 < iVar9) {
      iVar4 = 1;
      do {
        lVar5 = (long)iVar4;
        uVar3 = 0xffffffff;
        uVar2 = 0;
        do {
          uVar11 = uVar2;
          uVar1 = DU[lVar5];
          uVar3 = uVar3 + 1;
          if ((long)uVar10 < lVar5) break;
          lVar5 = lVar5 + 1;
          uVar2 = uVar11 + 1;
        } while (uVar1 == 0);
        uVar2 = uVar3;
        if (0xf < (int)uVar3) {
          uVar11 = uVar11 >> 4;
          iVar12 = uVar11 + (uVar11 == 0);
          do {
            stbiw__jpg_writeBits(s,bitBuf,bitCnt,M16zeroes);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
          uVar2 = uVar3 & 0xf;
        }
        uVar11 = -uVar1;
        if (0 < (int)uVar1) {
          uVar11 = uVar1;
        }
        iVar12 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        bits[1] = ((ushort)iVar12 ^ 0xffe0) + 0x21;
        if (uVar11 < 2) {
          bits[1] = 1;
        }
        iVar12 = uVar3 + iVar4;
        bits[0] = ~(ushort)(-1 << ((byte)bits[1] & 0x1f)) &
                  (short)((int)uVar1 >> 0x1f) + (short)uVar1;
        stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTAC[(int)(uVar2 * 0x10 + (uint)(byte)bits[1])]);
        stbiw__jpg_writeBits(s,bitBuf,bitCnt,bits);
        iVar4 = iVar4 + uVar3 + 1;
      } while (iVar12 < iVar9);
    }
    if (iVar9 == 0x3f) {
      return DU[0];
    }
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,EOB);
  return DU[0];
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, int du_stride, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, j, n, diff, end0pos, x, y;
   int DU[64];

   // DCT rows
   for(dataOff=0, n=du_stride*8; dataOff<n; dataOff+=du_stride) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+du_stride], &CDU[dataOff+du_stride*2], &CDU[dataOff+du_stride*3], &CDU[dataOff+du_stride*4],
                     &CDU[dataOff+du_stride*5], &CDU[dataOff+du_stride*6], &CDU[dataOff+du_stride*7]);
   }
   // Quantize/descale/zigzag the coefficients
   for(y = 0, j=0; y < 8; ++y) {
      for(x = 0; x < 8; ++x,++j) {
         float v;
         i = y*du_stride+x;
         v = CDU[i]*fdtbl[j];
         // DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
         // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
         DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
      }
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}